

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O1

int Int2_ManChainResolve(Int2_Man_t *p,clause *c,int iLit,int varA)

{
  int iVar1;
  
  iVar1 = Int2_ManChainStart(p,c);
  if (iLit < 0) {
    __assert_fail("iLit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2i.c"
                  ,0x89,"int Int2_ManChainResolve(Int2_Man_t *, clause *, int, int)");
  }
  if (varA != 0) {
    iVar1 = Gia_ManHashOr(p->pGia,iLit,iVar1);
    return iVar1;
  }
  iVar1 = Gia_ManHashAnd(p->pGia,iLit,iVar1);
  return iVar1;
}

Assistant:

int Int2_ManChainResolve( Int2_Man_t * p, clause * c, int iLit, int varA )
{
    int iLit2 = Int2_ManChainStart( p, c );
    assert( iLit >= 0 );
    if ( varA )
        iLit = Gia_ManHashOr( p->pGia, iLit, iLit2 );
    else
        iLit = Gia_ManHashAnd( p->pGia, iLit, iLit2 );
    return iLit;
}